

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall
wabt::(anonymous_namespace)::CWriter::
Spill<wabt::(anonymous_namespace)::CWriter::Write(wabt::intrusive_list<wabt::Expr>const&)::__0>
          (CWriter *this,TypeVector *types,anon_class_8_1_f948b21d *src)

{
  byte bVar1;
  long lVar2;
  pointer pTVar3;
  char (*u) [2];
  ulong uVar4;
  Newline *in_R8;
  int iVar5;
  StackVar local_40;
  
  lVar2 = (long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3;
  if (lVar2 == 1) {
    local_40.index = *src->num_params;
    local_40.type.enum_ = Any;
    local_40.type.type_index_ = 0;
    Write<char_const(&)[7],wabt::(anonymous_namespace)::StackVar,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
              (this,(char (*) [7])&local_40,(StackVar *)src,(char (*) [2])0x0,in_R8);
  }
  else {
    if (lVar2 == 0) {
      __assert_fail("types.size() > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc"
                    ,0xba2,
                    "void wabt::(anonymous namespace)::CWriter::Spill(const TypeVector &, const sources &) [sources = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/c-writer.cc:4249:17)]"
                   );
    }
    pTVar3 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
        super__Vector_impl_data._M_finish != pTVar3) {
      iVar5 = 0;
      uVar4 = 0;
      do {
        bVar1 = anon_unknown_0::CWriter::MangleType(pTVar3[uVar4]);
        anon_unknown_0::CWriter::Writef((CWriter *)this,"tmp.%c%d = ",(ulong)bVar1,uVar4);
        local_40.index = *src->num_params + iVar5;
        local_40.type.enum_ = Any;
        local_40.type.type_index_ = 0;
        Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                  (this,&local_40,u,(Newline *)0x0);
        uVar4 = (ulong)((int)uVar4 + 1);
        pTVar3 = (types->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar5 = iVar5 + -1;
      } while (uVar4 < (ulong)((long)(types->
                                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pTVar3 >> 3))
      ;
    }
  }
  return;
}

Assistant:

void CWriter::Spill(const TypeVector& types, const sources& src) {
  assert(types.size() > 0);

  if (types.size() == 1) {
    Write("tmp = ", src(0), ";", Newline());
    return;
  }

  for (Index i = 0; i < types.size(); ++i) {
    Writef("tmp.%c%d = ", MangleType(types.at(i)), i);
    Write(src(i), ";", Newline());
  }
}